

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000022bf40 = 0x2d2d2d2d2d2d2d;
    uRam000000000022bf47._0_1_ = '-';
    uRam000000000022bf47._1_1_ = '-';
    uRam000000000022bf47._2_1_ = '-';
    uRam000000000022bf47._3_1_ = '-';
    uRam000000000022bf47._4_1_ = '-';
    uRam000000000022bf47._5_1_ = '-';
    uRam000000000022bf47._6_1_ = '-';
    uRam000000000022bf47._7_1_ = '-';
    DAT_0022bf30 = '-';
    DAT_0022bf30_1._0_1_ = '-';
    DAT_0022bf30_1._1_1_ = '-';
    DAT_0022bf30_1._2_1_ = '-';
    DAT_0022bf30_1._3_1_ = '-';
    DAT_0022bf30_1._4_1_ = '-';
    DAT_0022bf30_1._5_1_ = '-';
    DAT_0022bf30_1._6_1_ = '-';
    uRam000000000022bf38 = 0x2d2d2d2d2d2d2d;
    DAT_0022bf3f = 0x2d;
    DAT_0022bf20 = '-';
    DAT_0022bf20_1._0_1_ = '-';
    DAT_0022bf20_1._1_1_ = '-';
    DAT_0022bf20_1._2_1_ = '-';
    DAT_0022bf20_1._3_1_ = '-';
    DAT_0022bf20_1._4_1_ = '-';
    DAT_0022bf20_1._5_1_ = '-';
    DAT_0022bf20_1._6_1_ = '-';
    uRam000000000022bf28._0_1_ = '-';
    uRam000000000022bf28._1_1_ = '-';
    uRam000000000022bf28._2_1_ = '-';
    uRam000000000022bf28._3_1_ = '-';
    uRam000000000022bf28._4_1_ = '-';
    uRam000000000022bf28._5_1_ = '-';
    uRam000000000022bf28._6_1_ = '-';
    uRam000000000022bf28._7_1_ = '-';
    DAT_0022bf10 = '-';
    DAT_0022bf10_1._0_1_ = '-';
    DAT_0022bf10_1._1_1_ = '-';
    DAT_0022bf10_1._2_1_ = '-';
    DAT_0022bf10_1._3_1_ = '-';
    DAT_0022bf10_1._4_1_ = '-';
    DAT_0022bf10_1._5_1_ = '-';
    DAT_0022bf10_1._6_1_ = '-';
    uRam000000000022bf18._0_1_ = '-';
    uRam000000000022bf18._1_1_ = '-';
    uRam000000000022bf18._2_1_ = '-';
    uRam000000000022bf18._3_1_ = '-';
    uRam000000000022bf18._4_1_ = '-';
    uRam000000000022bf18._5_1_ = '-';
    uRam000000000022bf18._6_1_ = '-';
    uRam000000000022bf18._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000022bf08._0_1_ = '-';
    uRam000000000022bf08._1_1_ = '-';
    uRam000000000022bf08._2_1_ = '-';
    uRam000000000022bf08._3_1_ = '-';
    uRam000000000022bf08._4_1_ = '-';
    uRam000000000022bf08._5_1_ = '-';
    uRam000000000022bf08._6_1_ = '-';
    uRam000000000022bf08._7_1_ = '-';
    DAT_0022bf4f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}